

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseCacheCoverage.cxx
# Opt level: O1

bool __thiscall cmParseCacheCoverage::LoadCoverageData(cmParseCacheCoverage *this,char *d)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  unsigned_long uVar4;
  char *pcVar5;
  unsigned_long dindex;
  ulong uVar6;
  Directory dir;
  string file;
  string path;
  Directory DStack_a8;
  string local_a0;
  string local_80;
  cmParseCacheCoverage *local_60;
  char *local_58;
  string local_50;
  
  local_60 = this;
  cmsys::Directory::Directory(&DStack_a8);
  local_58 = d;
  std::__cxx11::string::string((string *)&local_a0,d,(allocator *)&local_80);
  bVar2 = cmsys::Directory::Load(&DStack_a8,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    uVar4 = cmsys::Directory::GetNumberOfFiles(&DStack_a8);
    bVar2 = uVar4 == 0;
    if (!bVar2) {
      dindex = 0;
      uVar6 = 1;
      do {
        pcVar5 = cmsys::Directory::GetFile(&DStack_a8,dindex);
        std::__cxx11::string::string((string *)&local_a0,pcVar5,(allocator *)&local_80);
        iVar3 = std::__cxx11::string::compare((char *)&local_a0);
        if (((iVar3 != 0) && (iVar3 = std::__cxx11::string::compare((char *)&local_a0), iVar3 != 0))
           && (bVar2 = cmsys::SystemTools::FileIsDirectory(&local_a0), !bVar2)) {
          std::__cxx11::string::string((string *)&local_80,local_58,(allocator *)&local_50);
          std::__cxx11::string::append((char *)&local_80);
          std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_a0._M_dataplus._M_p);
          cmsys::SystemTools::GetFilenameLastExtension(&local_50,&local_80);
          iVar3 = std::__cxx11::string::compare((char *)&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((iVar3 == 0) && (bVar2 = ReadCMCovFile(local_60,local_80._M_dataplus._M_p), !bVar2)) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
            }
            goto LAB_002bcb3a;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        bVar2 = uVar4 <= uVar6;
        bVar1 = uVar6 < uVar4;
        dindex = uVar6;
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (bVar1);
    }
  }
  else {
LAB_002bcb3a:
    bVar2 = false;
  }
  cmsys::Directory::~Directory(&DStack_a8);
  return bVar2;
}

Assistant:

bool cmParseCacheCoverage::LoadCoverageData(const char* d)
{
  // load all the .mcov files in the specified directory
  cmsys::Directory dir;
  if (!dir.Load(d)) {
    return false;
  }
  size_t numf;
  unsigned int i;
  numf = dir.GetNumberOfFiles();
  for (i = 0; i < numf; i++) {
    std::string file = dir.GetFile(i);
    if (file != "." && file != ".." && !cmSystemTools::FileIsDirectory(file)) {
      std::string path = d;
      path += "/";
      path += file;
      if (cmSystemTools::GetFilenameLastExtension(path) == ".cmcov") {
        if (!this->ReadCMCovFile(path.c_str())) {
          return false;
        }
      }
    }
  }
  return true;
}